

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

TZDBNames * icu_63::TZDBNames::createInstance(UResourceBundle *rb,char *key)

{
  bool bVar1;
  UBool UVar2;
  UResourceBundle *pUVar3;
  UChar *pUVar4;
  UResourceBundle *resB;
  char *pcVar5;
  char *cs;
  UResourceBundle *local_b8;
  int local_8c;
  char **ppcStack_88;
  int32_t i_3;
  char **p;
  UChar *uregion;
  int32_t i_2;
  int32_t i_1;
  char **pRegion;
  UBool regionError;
  UResourceBundle *regionsRes;
  UChar *value;
  int32_t i;
  UBool isEmpty;
  UResourceBundle *rbTable;
  int32_t len;
  int32_t numRegions;
  char **regions;
  UChar **names;
  char *pcStack_20;
  UErrorCode status;
  char *key_local;
  UResourceBundle *rb_local;
  
  if (((rb == (UResourceBundle *)0x0) || (key == (char *)0x0)) || (*key == '\0')) {
    rb_local = (UResourceBundle *)0x0;
  }
  else {
    names._4_4_ = U_ZERO_ERROR;
    regions = (char **)0x0;
    _len = (char **)0x0;
    rbTable._4_4_ = 0;
    rbTable._0_4_ = 0;
    pcStack_20 = key;
    key_local = (char *)rb;
    pUVar3 = ures_getByKey_63(rb,key,(UResourceBundle *)0x0,(UErrorCode *)((long)&names + 4));
    UVar2 = ::U_FAILURE(names._4_4_);
    if (UVar2 == '\0') {
      regions = (char **)uprv_malloc_63(0x10);
      bVar1 = true;
      if (regions != (char **)0x0) {
        for (value._0_4_ = 0; (int)value < 2; value._0_4_ = (int)value + 1) {
          names._4_4_ = U_ZERO_ERROR;
          pUVar4 = ures_getStringByKey_63
                             (pUVar3,*(char **)(TZDBNAMES_KEYS + (long)(int)value * 8),
                              (int32_t *)&rbTable,(UErrorCode *)((long)&names + 4));
          UVar2 = ::U_FAILURE(names._4_4_);
          if ((UVar2 == '\0') && ((int)rbTable != 0)) {
            regions[(int)value] = (char *)pUVar4;
            bVar1 = false;
          }
          else {
            regions[(int)value] = (char *)0x0;
          }
        }
      }
      if (bVar1) {
        if (regions != (char **)0x0) {
          uprv_free_63(regions);
        }
        rb_local = (UResourceBundle *)0x0;
      }
      else {
        cs = "parseRegions";
        resB = ures_getByKey_63(pUVar3,"parseRegions",(UResourceBundle *)0x0,
                                (UErrorCode *)((long)&names + 4));
        bVar1 = false;
        UVar2 = ::U_SUCCESS(names._4_4_);
        if (((UVar2 != '\0') && (rbTable._4_4_ = ures_getSize_63(resB), 0 < rbTable._4_4_)) &&
           (_len = (char **)uprv_malloc_63((long)rbTable._4_4_ << 3), _len != (char **)0x0)) {
          _i_2 = _len;
          for (uregion._4_4_ = 0; uregion._4_4_ < rbTable._4_4_; uregion._4_4_ = uregion._4_4_ + 1)
          {
            *_i_2 = (char *)0x0;
            _i_2 = _i_2 + 1;
          }
          _i_2 = _len;
          for (uregion._0_4_ = 0; (int)(uint)uregion < rbTable._4_4_;
              uregion._0_4_ = (uint)uregion + 1) {
            names._4_4_ = U_ZERO_ERROR;
            cs = (char *)(ulong)(uint)uregion;
            pUVar4 = ures_getStringByIndex_63
                               (resB,(uint)uregion,(int32_t *)&rbTable,
                                (UErrorCode *)((long)&names + 4));
            UVar2 = ::U_FAILURE(names._4_4_);
            if (UVar2 != '\0') {
              bVar1 = true;
              break;
            }
            pcVar5 = (char *)uprv_malloc_63((long)((int)rbTable + 1));
            *_i_2 = pcVar5;
            if (*_i_2 == (char *)0x0) {
              bVar1 = true;
              break;
            }
            cs = *_i_2;
            u_UCharsToChars_63(pUVar4,cs,(int)rbTable);
            (*_i_2)[(int)rbTable] = '\0';
            _i_2 = _i_2 + 1;
          }
        }
        ures_close_63(resB);
        ures_close_63(pUVar3);
        if (bVar1) {
          if (regions != (char **)0x0) {
            uprv_free_63(regions);
          }
          if (_len != (char **)0x0) {
            ppcStack_88 = _len;
            for (local_8c = 0; local_8c < rbTable._4_4_; local_8c = local_8c + 1) {
              uprv_free_63(*ppcStack_88);
              ppcStack_88 = ppcStack_88 + 1;
            }
            uprv_free_63(_len);
          }
          rb_local = (UResourceBundle *)0x0;
        }
        else {
          pUVar3 = (UResourceBundle *)UMemory::operator_new((UMemory *)0x20,(size_t)cs);
          local_b8 = (UResourceBundle *)0x0;
          if (pUVar3 != (UResourceBundle *)0x0) {
            TZDBNames((TZDBNames *)pUVar3,(UChar **)regions,_len,rbTable._4_4_);
            local_b8 = pUVar3;
          }
          rb_local = local_b8;
        }
      }
    }
    else {
      rb_local = (UResourceBundle *)0x0;
    }
  }
  return (TZDBNames *)rb_local;
}

Assistant:

TZDBNames*
TZDBNames::createInstance(UResourceBundle* rb, const char* key) {
    if (rb == NULL || key == NULL || *key == 0) {
        return NULL;
    }

    UErrorCode status = U_ZERO_ERROR;

    const UChar **names = NULL;
    char** regions = NULL;
    int32_t numRegions = 0;

    int32_t len = 0;

    UResourceBundle* rbTable = NULL;
    rbTable = ures_getByKey(rb, key, rbTable, &status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    names = (const UChar **)uprv_malloc(sizeof(const UChar*) * TZDBNAMES_KEYS_SIZE);
    UBool isEmpty = TRUE;
    if (names != NULL) {
        for (int32_t i = 0; i < TZDBNAMES_KEYS_SIZE; i++) {
            status = U_ZERO_ERROR;
            const UChar *value = ures_getStringByKey(rbTable, TZDBNAMES_KEYS[i], &len, &status);
            if (U_FAILURE(status) || len == 0) {
                names[i] = NULL;
            } else {
                names[i] = value;
                isEmpty = FALSE;
            }
        }
    }

    if (isEmpty) {
        if (names != NULL) {
            uprv_free(names);
        }
        return NULL;
    }

    UResourceBundle *regionsRes = ures_getByKey(rbTable, "parseRegions", NULL, &status);
    UBool regionError = FALSE;
    if (U_SUCCESS(status)) {
        numRegions = ures_getSize(regionsRes);
        if (numRegions > 0) {
            regions = (char**)uprv_malloc(sizeof(char*) * numRegions);
            if (regions != NULL) {
                char **pRegion = regions;
                for (int32_t i = 0; i < numRegions; i++, pRegion++) {
                    *pRegion = NULL;
                }
                // filling regions
                pRegion = regions;
                for (int32_t i = 0; i < numRegions; i++, pRegion++) {
                    status = U_ZERO_ERROR;
                    const UChar *uregion = ures_getStringByIndex(regionsRes, i, &len, &status);
                    if (U_FAILURE(status)) {
                        regionError = TRUE;
                        break;
                    }
                    *pRegion = (char*)uprv_malloc(sizeof(char) * (len + 1));
                    if (*pRegion == NULL) {
                        regionError = TRUE;
                        break;
                    }
                    u_UCharsToChars(uregion, *pRegion, len);
                    (*pRegion)[len] = 0;
                }
            }
        }
    }
    ures_close(regionsRes);
    ures_close(rbTable);

    if (regionError) {
        if (names != NULL) {
            uprv_free(names);
        }
        if (regions != NULL) {
            char **p = regions;
            for (int32_t i = 0; i < numRegions; p++, i++) {
                uprv_free(*p);
            }
            uprv_free(regions);
        }
        return NULL;
    }

    return new TZDBNames(names, regions, numRegions);
}